

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXException.hpp
# Opt level: O0

void __thiscall
xercesc_4_0::SAXNotSupportedException::~SAXNotSupportedException(SAXNotSupportedException *this)

{
  void *in_RSI;
  SAXNotSupportedException *this_local;
  
  ~SAXNotSupportedException(this);
  XMemory::operator_delete((XMemory *)this,in_RSI);
  return;
}

Assistant:

class SAX_EXPORT SAXNotSupportedException : public SAXException
{

public:
	SAXNotSupportedException(MemoryManager* const manager = XMLPlatformUtils::fgMemoryManager);

  /**
    * Create a new SAXException.
    *
    * @param msg The error or warning message.
    * @param manager    Pointer to the memory manager to be used to
    *                   allocate objects.
    */
    SAXNotSupportedException(const XMLCh* const msg,
                             MemoryManager* const manager = XMLPlatformUtils::fgMemoryManager);

  /**
    * Create a new SAXException.
    *
    * @param msg The error or warning message.
    * @param manager    Pointer to the memory manager to be used to
    *                   allocate objects.
    */
    SAXNotSupportedException(const char* const msg,
                             MemoryManager* const manager = XMLPlatformUtils::fgMemoryManager);

  /**
    * Copy constructor
    *
    * @param toCopy The exception to be copy constructed
    */
    SAXNotSupportedException(const SAXException& toCopy);
}